

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexycal.cpp
# Opt level: O2

int found_token_and_restart(int token)

{
  char *__src;
  size_t sVar1;
  
  lexemeBuffer[(long)lexemeLength + -1] = '\0';
  __src = lexemeBuffer;
  sVar1 = strlen(lexemeBuffer);
  lastLexemeFound = (char *)malloc(sVar1 + 1);
  strcpy(lastLexemeFound,__src);
  clear_lexeme();
  currentState = 0;
  return token;
}

Assistant:

int found_token_and_restart(int token) {
    remove_last_char_from_lexeme();

    lastLexemeFound = (char *) malloc(strlen(lexemeBuffer) + 1); //Save the buffer
    strcpy(lastLexemeFound, lexemeBuffer);

    clear_lexeme();

    go_to_state(0);
    return token;
}